

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawIndirectBase *this,GLbitfield access)

{
  runtime_error *this_00;
  undefined4 in_register_00000014;
  allocator<char> *__a;
  int iVar1;
  char *__s;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  iVar1 = (int)this;
  if (iVar1 == 35000) {
    __s = "GL_READ_ONLY";
    __a = &local_12;
  }
  else if (iVar1 == 0x88b9) {
    __s = "GL_WRITE_ONLY";
    __a = &local_13;
  }
  else {
    if (iVar1 != 0x88ba) {
      this_00 = (runtime_error *)
                __cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,access));
      std::runtime_error::runtime_error(this_00,"Invalid access type!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __s = "GL_READ_WRITE";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string AccessToString(GLbitfield access)
	{
		switch (access)
		{
		case GL_READ_WRITE:
			return "GL_READ_WRITE";
			break;
		case GL_READ_ONLY:
			return "GL_READ_ONLY";
			break;
		case GL_WRITE_ONLY:
			return "GL_WRITE_ONLY";
			break;
		default:
			throw std::runtime_error("Invalid access type!");
			break;
		}
	}